

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractnetworkcache.cpp
# Opt level: O0

void __thiscall QNetworkCacheMetaData::setUrl(QNetworkCacheMetaData *this,QUrl *url)

{
  QNetworkCacheMetaDataPrivate *pQVar1;
  QUrl *in_RSI;
  long in_FS_OFFSET;
  QNetworkCacheMetaDataPrivate *p;
  QSharedDataPointer<QNetworkCacheMetaDataPrivate> *in_stack_ffffffffffffff90;
  QUrl *pQVar2;
  undefined1 local_38 [24];
  undefined1 local_20 [24];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = QSharedDataPointer<QNetworkCacheMetaDataPrivate>::data(in_stack_ffffffffffffff90);
  QUrl::operator=(&pQVar1->url,in_RSI);
  pQVar2 = &pQVar1->url;
  QString::QString((QString *)0x1718ef);
  QUrl::setPassword((QString *)pQVar2,(ParsingMode)local_20);
  QString::~QString((QString *)0x17190d);
  QString::QString((QString *)0x17192a);
  QUrl::setFragment((QString *)&pQVar1->url,(ParsingMode)local_38);
  QString::~QString((QString *)0x171945);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkCacheMetaData::setUrl(const QUrl &url)
{
    auto *p = d.data();
    p->url = url;
    p->url.setPassword(QString());
    p->url.setFragment(QString());
}